

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liblocate.c
# Opt level: O2

void locatePath(char **path,uint *pathLength,char *relPath,uint relPathLength,char *systemDir,
               uint systemDirLength,void *symbol)

{
  size_t sVar1;
  char *path_00;
  char *__src;
  uchar uVar2;
  char *path_01;
  ulong __n;
  ulong __n_00;
  uint uVar3;
  uint uVar4;
  ulong __n_01;
  ulong __n_02;
  uint uVar5;
  size_t __n_03;
  long lVar6;
  int iVar7;
  uint systemBasePathLength;
  uint bundlePathLength;
  ulong local_c0;
  char *bundlePath;
  char *executablePath;
  uint lengths [3];
  char *dir;
  char *libraryPath;
  uint libraryPathDirectoryLength;
  uint libraryPathLength;
  uint executablePathDirectoryLength;
  uint executablePathLength;
  char *dirs [3];
  
  __n_02 = (ulong)relPathLength;
  uVar2 = checkStringOutParameter(path,pathLength);
  if (uVar2 != '\0') {
    executablePath = (char *)0x0;
    executablePathLength = 0;
    getExecutablePath(&executablePath,&executablePathLength);
    executablePathDirectoryLength = 0;
    bundlePath = (char *)0x0;
    bundlePathLength = 0;
    getBundlePath(&bundlePath,&bundlePathLength);
    libraryPath = (char *)0x0;
    libraryPathLength = 0;
    local_c0 = (ulong)systemDirLength;
    getLibraryPath(symbol,&libraryPath,&libraryPathLength);
    libraryPathDirectoryLength = 0;
    getDirectoryPart(libraryPath,libraryPathLength,&libraryPathDirectoryLength);
    getDirectoryPart(executablePath,executablePathLength,&executablePathDirectoryLength);
    __src = bundlePath;
    uVar4 = bundlePathLength;
    uVar3 = libraryPathDirectoryLength;
    if (libraryPathDirectoryLength < executablePathDirectoryLength) {
      uVar3 = executablePathDirectoryLength;
    }
    lengths[0] = libraryPathDirectoryLength;
    __n_01 = (ulong)bundlePathLength;
    if (uVar3 <= bundlePathLength + 0x13) {
      uVar3 = bundlePathLength + 0x13;
    }
    dirs[0] = libraryPath;
    dirs[1] = executablePath;
    dirs[2] = bundlePath;
    lengths[1] = executablePathDirectoryLength;
    lengths[2] = bundlePathLength;
    path_01 = (char *)malloc((ulong)(relPathLength + 9 + uVar3));
    __n = local_c0 & 0xffffffff;
    for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
      uVar3 = lengths[lVar6];
      __n_00 = (ulong)uVar3;
      if (__n_00 != 0) {
        path_00 = dirs[lVar6];
        memcpy(path_01,path_00,__n_00);
        __n_03 = 1;
        while (sVar1 = __n_03 + 3, sVar1 != 0xd) {
          memcpy(path_01 + __n_00,"/../../",__n_03);
          memcpy(path_01 + (uVar3 + (int)__n_03),relPath,__n_02);
          uVar5 = (int)__n_03 + relPathLength + uVar3;
          path_01[uVar5] = '\0';
          uVar2 = fileExists(path_01,uVar5);
          __n_03 = sVar1;
          if (uVar2 != '\0') {
            uVar3 = (uVar3 + (int)sVar1) - 3;
            goto LAB_00101753;
          }
        }
        iVar7 = (int)local_c0;
        if (iVar7 != 0) {
          getSystemBasePath(path_00,uVar3 + 1,&systemBasePathLength);
          uVar3 = systemBasePathLength;
          if ((ulong)systemBasePathLength != 0) {
            path_01[systemBasePathLength] = '/';
            memcpy(path_01 + (systemBasePathLength + 1),systemDir,__n);
            uVar5 = uVar3 + iVar7 + 1;
            path_01[uVar5] = '/';
            uVar3 = uVar3 + 2 + iVar7;
            memcpy(path_01 + uVar3,relPath,__n_02);
            uVar5 = relPathLength + uVar5 + 1;
            path_01[uVar5] = '\0';
            uVar2 = fileExists(path_01,uVar5);
            if (uVar2 != '\0') goto LAB_00101753;
          }
        }
      }
    }
    memcpy(path_01,__src,__n_01);
    builtin_strncpy(path_01 + __n_01,"/Contents/Resources/",0x14);
    uVar3 = uVar4 + 0x14;
    memcpy(path_01 + uVar3,relPath,__n_02);
    uVar4 = uVar4 + relPathLength + 0x14;
    path_01[uVar4] = '\0';
    uVar2 = fileExists(path_01,uVar4);
    if (uVar2 == '\0') {
      invalidateStringOutParameter(path,pathLength);
    }
    else {
LAB_00101753:
      copyToStringOutParameter(path_01,uVar3,path,pathLength);
    }
    free(libraryPath);
    free(executablePath);
    free(bundlePath);
    free(path_01);
  }
  return;
}

Assistant:

void locatePath(char ** path, unsigned int * pathLength, const char * relPath, unsigned int relPathLength,
    const char * systemDir, unsigned int systemDirLength, void * symbol)
{
    // Early exit when invalid out-parameters are passed
    if (!checkStringOutParameter(path, pathLength))
    {
        return;
    }

    // Obtain executable path
    char * executablePath = 0x0;
    unsigned int executablePathLength = 0;
    getExecutablePath(&executablePath, &executablePathLength);
    unsigned int executablePathDirectoryLength = 0;

    // Obtain bundle path (in case of macOS)
    char * bundlePath = 0x0;
    unsigned int bundlePathLength = 0;
    getBundlePath(&bundlePath, &bundlePathLength);

    // Obtain library path
    char * libraryPath = 0x0;
    unsigned int libraryPathLength = 0;
    getLibraryPath(symbol, &libraryPath, &libraryPathLength);
    unsigned int libraryPathDirectoryLength = 0;

    // Extract directory parts of executable and library paths
    getDirectoryPart(libraryPath, libraryPathLength, &libraryPathDirectoryLength);
    getDirectoryPart(executablePath, executablePathLength, &executablePathDirectoryLength);

    // Compute the size of the maximal possible path to circumvent reallocation of output
    unsigned int maxLength = executablePathDirectoryLength;
    maxLength = maxLength > libraryPathDirectoryLength ? maxLength : libraryPathDirectoryLength;
    maxLength = maxLength > bundlePathLength + 19 ? maxLength : bundlePathLength + 19; // for "/Contents/Resources"
    maxLength += relPathLength + 7 + 2; // for the extra upward path checks, the extra path delimiter and null byte suffix

    const char * dirs[] = { libraryPath, executablePath, bundlePath };
    const unsigned int lengths[] = { libraryPathDirectoryLength, executablePathDirectoryLength, bundlePathLength };

    char * subdir = (char *)malloc(sizeof(char) * maxLength);
    unsigned int subdirLength = 0;
    unsigned int resultdirLength = 0;

    // Check libraryPath, executablePath, and bundlePath as base directories
    for (unsigned char i = 0; i < 3; ++i)
    {
        // Obtain current base directory and associated length
        const char * dir = dirs[i];
        const unsigned int length = lengths[i];

        // Early out for missing base directory
        if (length <= 0)
        {
            continue;
        }

        // Initialize directory to test with base directory
        memcpy(subdir, dir, length);

        // Check <basedir>/<relpath>, <basedir>/../<relpath>, and <basedir>/../../<relpath>
        for (unsigned char j = 0; j < 3; ++j)
        {
            unsigned char relDirLength = j * 3 + 1;

            subdirLength = length;
            // Copy either '/', '/../', or '/../../', depending on current iteration
            memcpy(subdir+subdirLength, "/../../", relDirLength);
            subdirLength += relDirLength;
            memcpy(subdir+subdirLength, relPath, relPathLength);
            resultdirLength = subdirLength;
            subdirLength += relPathLength;

            // End subdirectory with null byte for system functions
            subdir[subdirLength] = 0;

            if (fileExists(subdir, subdirLength)) // successfully found directory
            {
                copyToStringOutParameter(subdir, resultdirLength, path, pathLength);

                goto out;
            }
        }

        if (systemDirLength <= 0)
            continue;

        // Check if it is a system path
        // length + 1 points to the '/' of the directory part of the path

        unsigned int systemBasePathLength;
        getSystemBasePath(dir, length + 1, &systemBasePathLength);

        if (systemBasePathLength > 0)
        {
            subdirLength = systemBasePathLength;
            memcpy(subdir+subdirLength, "/", 1);
            subdirLength += 1;
            memcpy(subdir+subdirLength, systemDir, systemDirLength);
            subdirLength += systemDirLength;
            memcpy(subdir+subdirLength, "/", 1);
            subdirLength += 1;
            memcpy(subdir+subdirLength, relPath, relPathLength);
            resultdirLength = subdirLength;
            subdirLength += relPathLength;

            // End subdirectory with null byte for system functions
            subdir[subdirLength] = 0;

            if (fileExists(subdir, subdirLength)) // successfully found directory
            {
                copyToStringOutParameter(subdir, resultdirLength, path, pathLength);

                goto out;
            }
        }
    }

    // Check app bundle resources
    {
        // Obtain current base directory and associated length
        const char * dir = dirs[2];
        const unsigned int length = lengths[2];

        // Initialize directory to test with base directory
        memcpy(subdir, dir, length);

        subdirLength = length;
        memcpy(subdir+subdirLength, "/Contents/Resources/", 20);
        subdirLength += 20;
        memcpy(subdir+subdirLength, relPath, relPathLength);
        resultdirLength = subdirLength;
        subdirLength += relPathLength;

        // End subdirectory with null byte for system functions
        subdir[subdirLength] = 0;

        if (fileExists(subdir, subdirLength)) // successfully found directory
        {
            copyToStringOutParameter(subdir, resultdirLength, path, pathLength);

            goto out;
        }
    }

    // Could not find path
    invalidateStringOutParameter(path, pathLength);

out:
    // Free temporary memory
    free(libraryPath);
    free(executablePath);
    free(bundlePath);
    free(subdir);
}